

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestReaderTestparseWithDetailError::runTestCase(TestReaderTestparseWithDetailError *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> errors;
  Value root;
  Reader reader;
  string local_178;
  Value local_158;
  Reader local_130;
  
  Json::Reader::Reader(&local_130);
  Json::Value::Value(&local_158,nullValue);
  paVar1 = &local_178.field_2;
  local_178._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,"{ \"property\" : \"v\\alue\" }","");
  bVar2 = Json::Reader::parse(&local_130,&local_178,&local_158,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar1) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6e3,"!ok");
  }
  Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_178,&local_130);
  iVar3 = std::__cxx11::string::compare((char *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar1) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if (iVar3 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6e6,
               "reader.getFormattedErrorMessages() == \"* Line 1, Column 16\\n  Bad escape sequence in string\\nSee \" \"Line 1, Column 20 for detail.\\n\""
              );
  }
  Json::Reader::getStructuredErrors
            ((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
              *)&local_178,&local_130);
  if (local_178._M_string_length - (long)local_178._M_dataplus._M_p != 0x30) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6e9,"errors.size() == 1");
  }
  if ((pointer)local_178._M_string_length != local_178._M_dataplus._M_p) {
    if (*(size_type *)local_178._M_dataplus._M_p != 0xf) {
      JsonTest::TestResult::addFailure
                ((this->super_ReaderTest).super_TestCase.result_,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
                 ,0x6ea,"errors.at(0).offset_start == 15");
    }
    if ((pointer)local_178._M_string_length != local_178._M_dataplus._M_p) {
      if (*(long *)(local_178._M_dataplus._M_p + 8) != 0x17) {
        JsonTest::TestResult::addFailure
                  ((this->super_ReaderTest).super_TestCase.result_,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
                   ,0x6eb,"errors.at(0).offset_limit == 23");
      }
      if ((pointer)local_178._M_string_length != local_178._M_dataplus._M_p) {
        iVar3 = std::__cxx11::string::compare(local_178._M_dataplus._M_p + 0x10);
        if (iVar3 != 0) {
          JsonTest::TestResult::addFailure
                    ((this->super_ReaderTest).super_TestCase.result_,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
                     ,0x6ec,"errors.at(0).message == \"Bad escape sequence in string\"");
        }
        std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
        ~vector((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
                 *)&local_178);
        Json::Value::~Value(&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130.commentsBefore_._M_dataplus._M_p != &local_130.commentsBefore_.field_2) {
          operator_delete(local_130.commentsBefore_._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130.document_._M_dataplus._M_p != &local_130.document_.field_2) {
          operator_delete(local_130.document_._M_dataplus._M_p);
        }
        std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                  (&local_130.errors_);
        std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                  ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_130);
        return;
      }
    }
  }
  uVar4 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  Json::Value::~Value(&local_158);
  Json::Reader::~Reader(&local_130);
  _Unwind_Resume(uVar4);
}

Assistant:

JSONTEST_FIXTURE(ReaderTest, parseWithDetailError) {
  Json::Reader reader;
  Json::Value root;
  bool ok = reader.parse("{ \"property\" : \"v\\alue\" }", root);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT(reader.getFormattedErrorMessages() ==
                  "* Line 1, Column 16\n  Bad escape sequence in string\nSee "
                  "Line 1, Column 20 for detail.\n");
  std::vector<Json::Reader::StructuredError> errors =
      reader.getStructuredErrors();
  JSONTEST_ASSERT(errors.size() == 1);
  JSONTEST_ASSERT(errors.at(0).offset_start == 15);
  JSONTEST_ASSERT(errors.at(0).offset_limit == 23);
  JSONTEST_ASSERT(errors.at(0).message == "Bad escape sequence in string");
}